

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt,int inputchk,int depth)

{
  byte bVar1;
  xmlChar xVar2;
  int iVar3;
  xmlElementContentType xVar4;
  _xmlElementContent *p_Var5;
  _xmlElementContent *p_Var6;
  xmlElementContentPtr cur;
  xmlChar *pxVar7;
  xmlParserInputPtr pxVar8;
  long lVar9;
  byte bVar10;
  xmlDocPtr doc;
  byte bVar11;
  xmlElementContentPtr pxVar12;
  bool bVar13;
  _xmlElementContent *local_40;
  
  if ((0x80 < depth) && ((0x800 < depth || ((ctxt->options & 0x80000U) == 0)))) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,
                      "xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n"
                      ,depth);
    return (xmlElementContentPtr)0x0;
  }
  xmlSkipBlankChars(ctxt);
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (*ctxt->input->cur == '(') {
    iVar3 = ctxt->input->id;
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
    p_Var6 = xmlParseElementChildrenContentDeclPriv(ctxt,iVar3,depth + 1);
    xmlSkipBlankChars(ctxt);
    if (ctxt->progressive != 0) goto LAB_001629ad;
    lVar9 = (long)ctxt->input->end - (long)ctxt->input->cur;
  }
  else {
    pxVar7 = xmlParseName(ctxt);
    if (pxVar7 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    p_Var6 = xmlNewDocElementContent(ctxt->myDoc,pxVar7,XML_ELEMENT_CONTENT_ELEMENT);
    if (p_Var6 == (xmlElementContentPtr)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    xVar2 = *ctxt->input->cur;
    if (xVar2 == '*') {
      p_Var6->ocur = XML_ELEMENT_CONTENT_MULT;
LAB_00162975:
      xmlNextChar(ctxt);
    }
    else {
      if (xVar2 == '+') {
        p_Var6->ocur = XML_ELEMENT_CONTENT_PLUS;
        goto LAB_00162975;
      }
      if (xVar2 == '?') {
        p_Var6->ocur = XML_ELEMENT_CONTENT_OPT;
        goto LAB_00162975;
      }
      p_Var6->ocur = XML_ELEMENT_CONTENT_ONCE;
    }
    if (ctxt->progressive != 0) goto LAB_001629ad;
    lVar9 = (long)ctxt->input->end - (long)ctxt->input->cur;
  }
  if (lVar9 < 0xfa) {
    xmlGROW(ctxt);
  }
LAB_001629ad:
  xmlSkipBlankChars(ctxt);
  if (ctxt->progressive == 0) {
    pxVar8 = ctxt->input;
    if ((500 < (long)pxVar8->cur - (long)pxVar8->base) &&
       ((long)pxVar8->end - (long)pxVar8->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  pxVar8 = ctxt->input;
  bVar1 = *pxVar8->cur;
  local_40 = p_Var6;
  if ((bVar1 == 0x29) || (ctxt->instate == XML_PARSER_EOF)) {
    cur = (_xmlElementContent *)0x0;
  }
  else {
    cur = (xmlElementContentPtr)0x0;
    pxVar12 = p_Var6;
    bVar10 = 0;
    do {
      bVar11 = bVar1;
      if (bVar1 != 0x7c) {
        if (bVar1 != 0x2c) {
          xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,(char *)0x0);
          goto LAB_00162dc0;
        }
        if ((bVar10 != 0) && (bVar11 = bVar10, bVar10 != 0x2c)) goto LAB_00162dac;
        xmlNextChar(ctxt);
        p_Var6 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_SEQ);
        if (p_Var6 != (xmlElementContentPtr)0x0) goto LAB_00162aa1;
        if ((cur != (xmlElementContentPtr)0x0) && (cur != local_40)) {
          xmlFreeDocElementContent(ctxt->myDoc,cur);
        }
LAB_00162dfd:
        doc = ctxt->myDoc;
LAB_00162e32:
        xmlFreeDocElementContent(doc,local_40);
        return (xmlElementContentPtr)0x0;
      }
      if ((bVar10 != 0) && (bVar11 = bVar10, bVar10 != 0x7c)) {
LAB_00162dac:
        xmlFatalErrMsgInt(ctxt,XML_ERR_SEPARATOR_REQUIRED,
                          "xmlParseElementChildrenContentDecl : \'%c\' expected\n",(uint)bVar10);
LAB_00162dc0:
        if ((cur != (xmlElementContentPtr)0x0) && (cur != local_40)) {
          xmlFreeDocElementContent(ctxt->myDoc,cur);
        }
        if (local_40 == (_xmlElementContent *)0x0) {
          return (xmlElementContentPtr)0x0;
        }
        goto LAB_00162dfd;
      }
      xmlNextChar(ctxt);
      p_Var6 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
      if (p_Var6 == (xmlElementContentPtr)0x0) goto LAB_00162dc0;
LAB_00162aa1:
      if (cur == (xmlElementContentPtr)0x0) {
        p_Var6->c1 = local_40;
        bVar13 = local_40 != (_xmlElementContent *)0x0;
        cur = local_40;
        local_40 = p_Var6;
        if (bVar13) goto LAB_00162ad0;
      }
      else {
        pxVar12->c2 = p_Var6;
        p_Var6->parent = pxVar12;
        p_Var6->c1 = cur;
LAB_00162ad0:
        cur->parent = p_Var6;
      }
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      xmlSkipBlankChars(ctxt);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      if (*ctxt->input->cur != '(') {
        pxVar7 = xmlParseName(ctxt);
        if (pxVar7 == (xmlChar *)0x0) {
          xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
          if (local_40 == (_xmlElementContent *)0x0) {
            return (xmlElementContentPtr)0x0;
          }
        }
        else {
          cur = xmlNewDocElementContent(ctxt->myDoc,pxVar7,XML_ELEMENT_CONTENT_ELEMENT);
          if (cur != (xmlElementContentPtr)0x0) {
            xVar2 = *ctxt->input->cur;
            if (xVar2 == '*') {
              cur->ocur = XML_ELEMENT_CONTENT_MULT;
            }
            else if (xVar2 == '+') {
              cur->ocur = XML_ELEMENT_CONTENT_PLUS;
            }
            else {
              if (xVar2 != '?') {
                cur->ocur = XML_ELEMENT_CONTENT_ONCE;
                goto LAB_00162be0;
              }
              cur->ocur = XML_ELEMENT_CONTENT_OPT;
            }
            xmlNextChar(ctxt);
            goto LAB_00162be0;
          }
          if (local_40 == (_xmlElementContent *)0x0) {
            return (xmlElementContentPtr)0x0;
          }
        }
        doc = ctxt->myDoc;
        goto LAB_00162e32;
      }
      iVar3 = ctxt->input->id;
      xmlNextChar(ctxt);
      xmlSkipBlankChars(ctxt);
      cur = xmlParseElementChildrenContentDeclPriv(ctxt,iVar3,depth + 1);
      xmlSkipBlankChars(ctxt);
LAB_00162be0:
      xmlSkipBlankChars(ctxt);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      pxVar8 = ctxt->input;
      bVar1 = *pxVar8->cur;
    } while ((bVar1 != 0x29) && (pxVar12 = p_Var6, bVar10 = bVar11, ctxt->instate != XML_PARSER_EOF)
            );
  }
  if ((p_Var6 != (_xmlElementContent *)0x0) && (cur != (_xmlElementContent *)0x0)) {
    p_Var6->c2 = cur;
    cur->parent = p_Var6;
  }
  if (pxVar8->id != inputchk) {
    xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                   "Element content declaration doesn\'t start and stop in the same entity\n");
  }
  xmlNextChar(ctxt);
  xVar2 = *ctxt->input->cur;
  if (xVar2 == '*') {
    if (local_40 != (_xmlElementContent *)0x0) {
      local_40->ocur = XML_ELEMENT_CONTENT_MULT;
      xVar4 = local_40->type;
      p_Var6 = local_40;
      while (xVar4 == XML_ELEMENT_CONTENT_OR) {
        p_Var5 = p_Var6->c1;
        if ((p_Var5 != (_xmlElementContent *)0x0) &&
           ((p_Var5->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
          p_Var5->ocur = XML_ELEMENT_CONTENT_ONCE;
        }
        p_Var6 = p_Var6->c2;
        if (p_Var6 == (_xmlElementContent *)0x0) break;
        if ((p_Var6->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT) {
          p_Var6->ocur = XML_ELEMENT_CONTENT_ONCE;
        }
        xVar4 = p_Var6->type;
      }
    }
  }
  else if (xVar2 == '+') {
    if ((local_40 != (_xmlElementContent *)0x0) &&
       (local_40->ocur =
             ((local_40->ocur & ~XML_ELEMENT_CONTENT_ONCE) != XML_ELEMENT_CONTENT_OPT) +
             XML_ELEMENT_CONTENT_MULT, p_Var6 != (_xmlElementContent *)0x0)) {
      bVar13 = false;
      do {
        if (p_Var6->type != XML_ELEMENT_CONTENT_OR) break;
        p_Var5 = p_Var6->c1;
        if ((p_Var5 != (_xmlElementContent *)0x0) &&
           ((p_Var5->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
          p_Var5->ocur = XML_ELEMENT_CONTENT_ONCE;
          bVar13 = true;
        }
        p_Var6 = p_Var6->c2;
        if ((p_Var6 != (_xmlElementContent *)0x0) &&
           ((p_Var6->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
          p_Var6->ocur = XML_ELEMENT_CONTENT_ONCE;
          bVar13 = true;
        }
      } while (p_Var6 != (_xmlElementContent *)0x0);
      if (bVar13) {
        local_40->ocur = XML_ELEMENT_CONTENT_MULT;
      }
    }
  }
  else {
    if (xVar2 != '?') {
      return local_40;
    }
    if (local_40 != (_xmlElementContent *)0x0) {
      local_40->ocur = (local_40->ocur - XML_ELEMENT_CONTENT_MULT < 2) + XML_ELEMENT_CONTENT_OPT;
    }
  }
  xmlNextChar(ctxt);
  return local_40;
}

Assistant:

static xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt, int inputchk,
                                       int depth) {
    xmlElementContentPtr ret = NULL, cur = NULL, last = NULL, op = NULL;
    const xmlChar *elem;
    xmlChar type = 0;

    DEBUG_ENTER(("xmlParseElementChildrenContentDeclPriv(%s, %d, %d);\n", dbgCtxt(ctxt), inputchk, depth));

    if (((depth > 128) && ((ctxt->options & XML_PARSE_HUGE) == 0)) ||
        (depth >  2048)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED,
"xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n",
                          depth);
	RETURN_PTR(NULL);
    }
    SKIP_BLANKS;
    GROW;
    if (RAW == '(') {
	int inputid = ctxt->input->id;

        /* Recurse on first child */
	NEXT;
	SKIP_BLANKS;
        cur = ret = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                           depth + 1);
	SKIP_BLANKS;
	GROW;
    } else {
	elem = xmlParseName(ctxt);
	if (elem == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
	    RETURN_PTR(NULL);
	}
        cur = ret = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	if (cur == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    RETURN_PTR(NULL);
	}
	GROW;
	if (RAW == '?') {
	    cur->ocur = XML_ELEMENT_CONTENT_OPT;
	    NEXT;
	} else if (RAW == '*') {
	    cur->ocur = XML_ELEMENT_CONTENT_MULT;
	    NEXT;
	} else if (RAW == '+') {
	    cur->ocur = XML_ELEMENT_CONTENT_PLUS;
	    NEXT;
	} else {
	    cur->ocur = XML_ELEMENT_CONTENT_ONCE;
	}
	GROW;
    }
    SKIP_BLANKS;
    SHRINK;
    while ((RAW != ')') && (ctxt->instate != XML_PARSER_EOF)) {
        /*
	 * Each loop we parse one separator and one element.
	 */
        if (RAW == ',') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name | Name , Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
		                  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		RETURN_PTR(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_SEQ);
	    if (op == NULL) {
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
	        xmlFreeDocElementContent(ctxt->myDoc, ret);
		RETURN_PTR(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else if (RAW == '|') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name , Name | Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
				  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		RETURN_PTR(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
	    if (op == NULL) {
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		RETURN_PTR(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED, NULL);
	    if ((last != NULL) && (last != ret))
	        xmlFreeDocElementContent(ctxt->myDoc, last);
	    if (ret != NULL)
		xmlFreeDocElementContent(ctxt->myDoc, ret);
	    RETURN_PTR(NULL);
	}
	GROW;
	SKIP_BLANKS;
	GROW;
	if (RAW == '(') {
	    int inputid = ctxt->input->id;
	    /* Recurse on second child */
	    NEXT;
	    SKIP_BLANKS;
	    last = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                          depth + 1);
	    SKIP_BLANKS;
	} else {
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		RETURN_PTR(NULL);
	    }
	    last = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	    if (last == NULL) {
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		RETURN_PTR(NULL);
	    }
	    if (RAW == '?') {
		last->ocur = XML_ELEMENT_CONTENT_OPT;
		NEXT;
	    } else if (RAW == '*') {
		last->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    } else if (RAW == '+') {
		last->ocur = XML_ELEMENT_CONTENT_PLUS;
		NEXT;
	    } else {
		last->ocur = XML_ELEMENT_CONTENT_ONCE;
	    }
	}
	SKIP_BLANKS;
	GROW;
    }
    if ((cur != NULL) && (last != NULL)) {
        cur->c2 = last;
	if (last != NULL)
	    last->parent = cur;
    }
    if (ctxt->input->id != inputchk) {
	xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn't start and stop in"
                       " the same entity\n");
    }
    NEXT;
    if (RAW == '?') {
	if (ret != NULL) {
	    if ((ret->ocur == XML_ELEMENT_CONTENT_PLUS) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_OPT;
	}
	NEXT;
    } else if (RAW == '*') {
	if (ret != NULL) {
	    ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    cur = ret;
	    /*
	     * Some normalization:
	     * (a | b* | c?)* == (a | b | c)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		cur = cur->c2;
	    }
	}
	NEXT;
    } else if (RAW == '+') {
	if (ret != NULL) {
	    int found = 0;

	    if ((ret->ocur == XML_ELEMENT_CONTENT_OPT) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_PLUS;
	    /*
	     * Some normalization:
	     * (a | b*)+ == (a | b)*
	     * (a | b?)+ == (a | b)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		cur = cur->c2;
	    }
	    if (found)
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
	}
	NEXT;
    }
    RETURN_PTR(ret);
}